

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
          (SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *this,Base *other
          )

{
  move_iterator<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_*> first;
  size_type sVar1;
  
  (this->super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                ).firstElement;
  (this->super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>).len = 0;
  (this->super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>).cap = 0;
  first._M_current = other->data_;
  if (first._M_current == (IntervalMap<unsigned_long,_std::monostate,_3U> *)other->firstElement) {
    (this->super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>).cap = 2;
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::
    append<std::move_iterator<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_*>_>
              (&this->super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,
               first,first._M_current + other->len);
    other->len = 0;
  }
  else {
    other->data_ = (pointer)0x0;
    (this->super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>).data_ =
         first._M_current;
    sVar1 = other->len;
    other->len = 0;
    (this->super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>).len =
         sVar1;
    sVar1 = other->cap;
    other->cap = 0;
    (this->super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>).cap =
         sVar1;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }